

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8SetIntra4Mode(VP8EncIterator *it,uint8_t *modes)

{
  int y;
  uint8_t *preds;
  uint8_t *modes_local;
  VP8EncIterator *it_local;
  
  preds = it->preds_;
  modes_local = modes;
  for (y = 4; 0 < y; y = y + -1) {
    *(undefined4 *)preds = *(undefined4 *)modes_local;
    preds = preds + it->enc_->preds_w_;
    modes_local = modes_local + 4;
  }
  *(byte *)it->mb_ = *(byte *)it->mb_ & 0xfc;
  return;
}

Assistant:

void VP8SetIntra4Mode(const VP8EncIterator* const it, const uint8_t* modes) {
  uint8_t* preds = it->preds_;
  int y;
  for (y = 4; y > 0; --y) {
    memcpy(preds, modes, 4 * sizeof(*modes));
    preds += it->enc_->preds_w_;
    modes += 4;
  }
  it->mb_->type_ = 0;
}